

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O0

bool __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ProceedQCWithTraits
          (Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,QuadAndLinTerms *body,int sens,double rhs,QPTermsTraits *qptt)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  MCType *i;
  int *in_RCX;
  int in_EDX;
  QuadAndLinTerms *in_RSI;
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  bool fND1;
  bool fLT1;
  QuadTerms *qpterms;
  LinTerms *lint;
  double in_stack_000001a0;
  double in_stack_000001a8;
  int in_stack_000001b4;
  QuadTerms *in_stack_000001b8;
  undefined4 in_stack_000001c0;
  int in_stack_000001c4;
  double in_stack_000001c8;
  LinTerms *in_stack_000001d0;
  QuadTerms *in_stack_000001d8;
  Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_000001e0;
  size_t in_stack_ffffffffffffff98;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffffa0;
  
  QuadAndLinTerms::GetLinTerms(in_RSI);
  QuadAndLinTerms::GetQPTerms(in_RSI);
  if ((*in_RCX == 0) && (sVar3 = LinTerms::size((LinTerms *)0x664f99), sVar3 == 0)) {
    if (((0.0 <= in_XMM0_Qa * (double)in_EDX) && (0 < in_EDX)) && (in_RCX[6] == 1)) {
      in_stack_ffffffffffffffa0 =
           &MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::MC(in_RDI)->
            super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ;
      QuadTerms::var1((QuadTerms *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      dVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::lb(in_stack_ffffffffffffffa0,(int)(in_stack_ffffffffffffff98 >> 0x20));
      if (0.0 <= dVar4) {
        bVar2 = AddStandardQC((Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                               *)CONCAT44(in_stack_000001c4,in_stack_000001c0),in_stack_000001b8,
                              in_stack_000001b4,in_stack_000001a8,in_stack_000001a0);
        return bVar2;
      }
    }
    if (((0.0 <= in_XMM0_Qa * (double)in_EDX) && (in_EDX < 0)) && (in_RCX[7] == 1)) {
      i = MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          ::MC(in_RDI);
      QuadTerms::var1((QuadTerms *)in_stack_ffffffffffffffa0,(size_t)i);
      dVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::lb(in_stack_ffffffffffffffa0,(int)((ulong)i >> 0x20));
      if (0.0 <= dVar4) {
        bVar2 = AddStandardQC((Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                               *)CONCAT44(in_stack_000001c4,in_stack_000001c0),in_stack_000001b8,
                              in_stack_000001b4,in_stack_000001a8,in_stack_000001a0);
        return bVar2;
      }
    }
    if (((in_XMM0_Qa * (double)in_EDX <= 0.0) && (0 < in_EDX)) &&
       ((in_RCX[6] == 0 && (in_RCX[7] != 0)))) {
      bVar2 = AddStandardQC((Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                             *)CONCAT44(in_stack_000001c4,in_stack_000001c0),in_stack_000001b8,
                            in_stack_000001b4,in_stack_000001a8,in_stack_000001a0);
      return bVar2;
    }
    if ((((in_XMM0_Qa * (double)in_EDX <= 0.0) && (in_EDX < 0)) && (in_RCX[7] == 0)) &&
       (in_RCX[6] != 0)) {
      bVar2 = AddStandardQC((Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                             *)CONCAT44(in_stack_000001c4,in_stack_000001c0),in_stack_000001b8,
                            in_stack_000001b4,in_stack_000001a8,in_stack_000001a0);
      return bVar2;
    }
  }
  else {
    sVar3 = LinTerms::size((LinTerms *)0x664fad);
    iVar1 = *in_RCX;
    if (((char)((sVar3 == 1) + (iVar1 == 1)) == '\x01') && (0.0 <= in_XMM0_Qa * (double)in_EDX)) {
      if (sVar3 == 1) {
        MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        ::MC(in_RDI);
        LinTerms::var((LinTerms *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        dVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::lb(in_stack_ffffffffffffffa0,(int)(in_stack_ffffffffffffff98 >> 0x20));
        if ((dVar4 < 0.0) ||
           (dVar4 = LinTerms::coef((LinTerms *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98),
           dVar4 * (double)in_EDX < 0.0)) {
          return false;
        }
      }
      if ((iVar1 == 1) && (*(double *)(in_RCX + 4) * (double)in_EDX < 0.0)) {
        return false;
      }
      if (((0 < in_EDX) && (in_RCX[6] == 0)) || ((in_EDX < 0 && (in_RCX[7] == 0)))) {
        bVar2 = AddRotatedQC(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8
                             ,in_stack_000001c4);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool ProceedQCWithTraits(const QuadAndLinTerms& body,
                           int sens, double rhs,
                           const QPTermsTraits& qptt) {
    const auto& lint = body.GetLinTerms();
    assert(lint.size() <= 1);
    assert(qptt.nDiffVars <= 1);
    const auto& qpterms = body.GetQPTerms();
    if (qptt.nDiffVars || lint.size()) {       // Rotated cone?
      const auto fLT1 = lint.size()==1;        // Constant in the lhs?
      const auto fND1 = qptt.nDiffVars==1;
      if (fLT1 + fND1 == 1 &&
          rhs * sens >= 0.0) {                 // ... >= ... + rhs
        if (fLT1 &&                            // Check lin term
            (MC().lb( lint.var(0) ) < 0.0 ||
             lint.coef(0)*sens < 0.0))
          return false;
        if (fND1 && qptt.coef12*sens<0.0)
          return false;
        if ((sens>0 &&
             qptt.nSamePos==0)
            ||
            (sens<0 &&
             qptt.nSameNeg==0))
          return AddRotatedQC(qpterms, lint, rhs,
                              qptt.iDiffVars);
      }
    } else {                          // Standard cone?
      if (0.0 <= rhs*sens &&          // It's x^2 >= ||y^2|| + |rhs|
          sens>0 && qptt.nSamePos==1 &&
          MC().lb(qpterms.var1(qptt.iSamePos))>=0.0)
        return AddStandardQC(qpterms, qptt.iSamePos, 0.0, rhs);
      if (0.0 <= rhs*sens &&
          sens<0 && qptt.nSameNeg==1 &&
          MC().lb(qpterms.var1(qptt.iSameNeg))>=0.0)
        return AddStandardQC(qpterms, qptt.iSameNeg, 0.0, rhs);
      if (0.0 >= rhs*sens &&          // |rhs| >= ||y^2||
          sens>0 && qptt.nSamePos==0 && qptt.nSameNeg)
        return AddStandardQC(qpterms, -1, rhs);
      if (0.0 >= rhs*sens &&
          sens<0 && qptt.nSameNeg==0 && qptt.nSamePos)
        return AddStandardQC(qpterms, -1, rhs);
    }
    return false;
  }